

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt32x4OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDInt32x4Operation::OpNeg(SIMDValue *value)

{
  undefined1 auVar1 [16];
  SIMDValue SVar2;
  
  auVar1._0_8_ = CONCAT44(-(value->field_0).i32[1],-(value->field_0).i32[0]);
  auVar1._8_4_ = -(value->field_0).i32[2];
  auVar1._12_4_ = -(value->field_0).i32[3];
  SVar2.field_0.i64[1] = auVar1._8_8_;
  SVar2.field_0.i64[0] = auVar1._0_8_;
  return (SIMDValue)SVar2.field_0;
}

Assistant:

SIMDValue SIMDInt32x4Operation::OpNeg(const SIMDValue& value)
    {
        X86SIMDValue x86Result;

        X86SIMDValue SIGNMASK, temp;
        X86SIMDValue negativeOnes = { { -1, -1, -1, -1 } };
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        temp.m128i_value = _mm_andnot_si128(v.m128i_value, negativeOnes.m128i_value); // (~value) & (negative ones)
        SIGNMASK.m128i_value = _mm_set1_epi32(0x00000001);                            // set SIGNMASK to 1
        x86Result.m128i_value = _mm_add_epi32(SIGNMASK.m128i_value, temp.m128i_value);// add 4 integers respectively

        return X86SIMDValue::ToSIMDValue(x86Result);
    }